

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ExceptionOr<kj::Array<unsigned_char>_>::~ExceptionOr
          (ExceptionOr<kj::Array<unsigned_char>_> *this)

{
  NullableValue<kj::Array<unsigned_char>_>::~NullableValue(&(this->value).ptr);
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)this);
  return;
}

Assistant:

ExceptionOr() = default;